

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

BasicBlock * __thiscall
mocker::ir::FunctionModule::getBasicBlock(FunctionModule *this,size_t labelID)

{
  const_iterator cVar1;
  size_t local_8;
  
  local_8 = labelID;
  cVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->bbMap)._M_h,&local_8);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    return *(BasicBlock **)
            ((long)cVar1.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_false>
                   ._M_cur + 0x10);
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

const BasicBlock &FunctionModule::getBasicBlock(std::size_t labelID) const {
  return bbMap.at(labelID);
}